

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

void __thiscall
InProcNativeEntryPointData::RecordInlineeFrameMap
          (InProcNativeEntryPointData *this,
          List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *tempInlineeFrameMap)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  Type this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (this->inlineeFrameMap != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1a8,"(this->inlineeFrameMap == nullptr)",
                       "this->inlineeFrameMap == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (0 < (tempInlineeFrameMap->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count) {
    local_50 = (undefined1  [8])
               &JsUtil::
                List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_1c549c0;
    data.filename._0_4_ = 0x1ab;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    this_00 = (Type)new<Memory::HeapAllocator>(0x30,alloc,0x300d4a);
    (this_00->
    super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>).buffer
         = (Type)0x0;
    (this_00->
    super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>).count
         = 0;
    (this_00->
    super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>).alloc
         = &Memory::HeapAllocator::Instance;
    (this_00->
    super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ed548;
    this_00->length = 0;
    this_00->increment = 4;
    this->inlineeFrameMap = this_00;
    JsUtil::
    List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
    ::
    Copy<JsUtil::List<NativeOffsetInlineeFramePair,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this_00,tempInlineeFrameMap);
  }
  return;
}

Assistant:

void
InProcNativeEntryPointData::RecordInlineeFrameMap(JsUtil::List<NativeOffsetInlineeFramePair, ArenaAllocator>* tempInlineeFrameMap)
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
    Assert(this->inlineeFrameMap == nullptr);
    if (tempInlineeFrameMap->Count() > 0)
    {
        this->inlineeFrameMap = HeapNew(InlineeFrameMap, &HeapAllocator::Instance);
        this->inlineeFrameMap->Copy(tempInlineeFrameMap);
    }
}